

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O1

void __thiscall OpenMD::MoleculeCreator::createConstraintElem(MoleculeCreator *this,Molecule *mol)

{
  _Rb_tree_header *p_Var1;
  ConstraintElem *pCVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  _Base_ptr p_Var5;
  ConstraintPair *pCVar6;
  pointer ppCVar7;
  StuntDouble *sdB;
  StuntDouble *sdA;
  set<OpenMD::StuntDouble_*,_std::less<OpenMD::StuntDouble_*>,_std::allocator<OpenMD::StuntDouble_*>_>
  sdSet;
  StuntDouble *local_70;
  StuntDouble *local_68;
  _Rb_tree<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*,_std::_Identity<OpenMD::StuntDouble_*>,_std::less<OpenMD::StuntDouble_*>,_std::allocator<OpenMD::StuntDouble_*>_>
  local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pCVar6 = (ConstraintPair *)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppCVar7 = (mol->constraintPairs_).
            super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppCVar7 !=
      (mol->constraintPairs_).
      super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pCVar6 = *ppCVar7;
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (pCVar6 != (ConstraintPair *)0x0) {
    do {
      local_68 = pCVar6->consElem1_->sd_;
      p_Var3 = &p_Var1->_M_header;
      for (p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
          (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
          p_Var5 = (&p_Var5->_M_left)[*(StuntDouble **)(p_Var5 + 1) < local_68]) {
        if (*(StuntDouble **)(p_Var5 + 1) >= local_68) {
          p_Var3 = p_Var5;
        }
      }
      p_Var4 = p_Var1;
      if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
         (p_Var4 = (_Rb_tree_header *)p_Var3,
         local_68 < (StuntDouble *)((_Rb_tree_header *)p_Var3)->_M_node_count)) {
        p_Var4 = p_Var1;
      }
      if (p_Var4 == p_Var1) {
        std::
        _Rb_tree<OpenMD::StuntDouble*,OpenMD::StuntDouble*,std::_Identity<OpenMD::StuntDouble*>,std::less<OpenMD::StuntDouble*>,std::allocator<OpenMD::StuntDouble*>>
        ::_M_insert_unique<OpenMD::StuntDouble*const&>
                  ((_Rb_tree<OpenMD::StuntDouble*,OpenMD::StuntDouble*,std::_Identity<OpenMD::StuntDouble*>,std::less<OpenMD::StuntDouble*>,std::allocator<OpenMD::StuntDouble*>>
                    *)&local_60,&local_68);
        pCVar2 = (ConstraintElem *)operator_new(0x28);
        ConstraintElem::ConstraintElem(pCVar2,local_68);
        Molecule::addConstraintElem(mol,pCVar2);
      }
      local_70 = pCVar6->consElem2_->sd_;
      p_Var3 = &p_Var1->_M_header;
      for (p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var5 != (_Base_ptr)0x0;
          p_Var5 = (&p_Var5->_M_left)[*(StuntDouble **)(p_Var5 + 1) < local_70]) {
        if (*(StuntDouble **)(p_Var5 + 1) >= local_70) {
          p_Var3 = p_Var5;
        }
      }
      p_Var5 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
         (p_Var5 = p_Var3, local_70 < *(StuntDouble **)(p_Var3 + 1))) {
        p_Var5 = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)p_Var5 == p_Var1) {
        std::
        _Rb_tree<OpenMD::StuntDouble*,OpenMD::StuntDouble*,std::_Identity<OpenMD::StuntDouble*>,std::less<OpenMD::StuntDouble*>,std::allocator<OpenMD::StuntDouble*>>
        ::_M_insert_unique<OpenMD::StuntDouble*const&>
                  ((_Rb_tree<OpenMD::StuntDouble*,OpenMD::StuntDouble*,std::_Identity<OpenMD::StuntDouble*>,std::less<OpenMD::StuntDouble*>,std::allocator<OpenMD::StuntDouble*>>
                    *)&local_60,&local_70);
        pCVar2 = (ConstraintElem *)operator_new(0x28);
        ConstraintElem::ConstraintElem(pCVar2,local_70);
        Molecule::addConstraintElem(mol,pCVar2);
      }
      ppCVar7 = ppCVar7 + 1;
      if (ppCVar7 ==
          (mol->constraintPairs_).
          super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pCVar6 = (ConstraintPair *)0x0;
      }
      else {
        pCVar6 = *ppCVar7;
      }
    } while (pCVar6 != (ConstraintPair *)0x0);
  }
  std::
  _Rb_tree<OpenMD::StuntDouble_*,_OpenMD::StuntDouble_*,_std::_Identity<OpenMD::StuntDouble_*>,_std::less<OpenMD::StuntDouble_*>,_std::allocator<OpenMD::StuntDouble_*>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void MoleculeCreator::createConstraintElem(Molecule* mol) {
    ConstraintPair* consPair;
    Molecule::ConstraintPairIterator cpi;
    std::set<StuntDouble*> sdSet;
    for (consPair = mol->beginConstraintPair(cpi); consPair != NULL;
         consPair = mol->nextConstraintPair(cpi)) {
      StuntDouble* sdA = consPair->getConsElem1()->getStuntDouble();
      if (sdSet.find(sdA) == sdSet.end()) {
        sdSet.insert(sdA);
        mol->addConstraintElem(new ConstraintElem(sdA));
      }

      StuntDouble* sdB = consPair->getConsElem2()->getStuntDouble();
      if (sdSet.find(sdB) == sdSet.end()) {
        sdSet.insert(sdB);
        mol->addConstraintElem(new ConstraintElem(sdB));
      }
    }
  }